

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client2.c
# Opt level: O3

int my_verify(void *data,mbedtls_x509_crt *crt,int depth,uint32_t *flags)

{
  char *__s;
  char buf [1024];
  char acStack_418 [1024];
  
  __s = acStack_418;
  printf("\nVerify requested for (Depth %d):\n",(ulong)(uint)depth);
  mbedtls_x509_crt_info(acStack_418,0x3ff,anon_var_dwarf_2f782 + 9,crt);
  printf("%s",acStack_418);
  if (*flags == 0) {
    __s = "  This certificate has no flags";
  }
  else {
    mbedtls_x509_crt_verify_info(acStack_418,0x400,"  ! ",*flags);
  }
  puts(__s);
  return 0;
}

Assistant:

static int my_verify( void *data, mbedtls_x509_crt *crt,
                      int depth, uint32_t *flags )
{
    char buf[1024];
    ((void) data);

    mbedtls_printf( "\nVerify requested for (Depth %d):\n", depth );
    mbedtls_x509_crt_info( buf, sizeof( buf ) - 1, "", crt );
    mbedtls_printf( "%s", buf );

    if ( ( *flags ) == 0 )
        mbedtls_printf( "  This certificate has no flags\n" );
    else
    {
        mbedtls_x509_crt_verify_info( buf, sizeof( buf ), "  ! ", *flags );
        mbedtls_printf( "%s\n", buf );
    }

    return( 0 );
}